

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_string_concat(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  sysbvm_object_tuple_t *psVar1;
  size_t __n;
  size_t __n_00;
  
  if ((left & 0xf) == 0 && left != 0) {
    __n_00 = (size_t)*(uint *)(left + 0xc);
  }
  else {
    __n_00 = 0;
  }
  if ((right & 0xf) == 0 && right != 0) {
    __n = (size_t)*(uint *)(right + 0xc);
  }
  else {
    __n = 0;
  }
  psVar1 = (sysbvm_object_tuple_t *)right;
  if ((__n_00 != 0) && (psVar1 = (sysbvm_object_tuple_t *)left, __n != 0)) {
    psVar1 = sysbvm_context_allocateByteTuple(context,(context->roots).stringType,__n + __n_00);
    memcpy(&psVar1->field_1,(void *)(left + 0x10),__n_00);
    memcpy((void *)((long)&psVar1->field_1 + __n_00),(void *)(right + 0x10),__n);
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_string_concat(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    size_t leftSize = sysbvm_tuple_getSizeInBytes(left);
    size_t rightSize = sysbvm_tuple_getSizeInBytes(right);

    if(leftSize == 0)
        return right;
    if(rightSize == 0)
        return left;

    size_t resultSize = leftSize + rightSize;
    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, resultSize);
    uint8_t *resultData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;
    memcpy(resultData, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(left)->bytes, leftSize);
    memcpy(resultData + leftSize, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(right)->bytes, rightSize);
    return result;
}